

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

bool duckdb::StringUtil::CIEquals(char *l1,idx_t l1_size,char *l2,idx_t l2_size)

{
  idx_t iVar1;
  bool bVar2;
  
  if (l1_size != l2_size) {
    return false;
  }
  bVar2 = l1_size == 0;
  if (!bVar2) {
    iVar1 = 0;
    do {
      if (ASCII_TO_LOWER_MAP[(byte)l1[iVar1]] != ASCII_TO_LOWER_MAP[(byte)l2[iVar1]]) {
        return false;
      }
      iVar1 = iVar1 + 1;
    } while (l1_size != iVar1);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool StringUtil::CIEquals(const char *l1, idx_t l1_size, const char *l2, idx_t l2_size) {
	if (l1_size != l2_size) {
		return false;
	}
	const auto charmap = ASCII_TO_LOWER_MAP;
	for (idx_t c = 0; c < l1_size; c++) {
		if (charmap[(uint8_t)l1[c]] != charmap[(uint8_t)l2[c]]) {
			return false;
		}
	}
	return true;
}